

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

Udata * luaS_newudata(lua_State *L,size_t s,Table *e)

{
  GCObject *pGVar1;
  Udata *u;
  Table *e_local;
  size_t s_local;
  lua_State *L_local;
  
  if (0xffffffffffffffd5 < s) {
    luaM_toobig(L);
  }
  pGVar1 = luaC_newobj(L,7,s + 0x28,(GCObject **)0x0,0);
  (pGVar1->h).lastfree = (Node *)s;
  (pGVar1->h).array = (TValue *)0x0;
  (pGVar1->h).node = (Node *)e;
  return (Udata *)pGVar1;
}

Assistant:

Udata *luaS_newudata (lua_State *L, size_t s, Table *e) {
  Udata *u;
  if (s > MAX_SIZET - sizeof(Udata))
    luaM_toobig(L);
  u = &luaC_newobj(L, LUA_TUSERDATA, sizeof(Udata) + s, NULL, 0)->u;
  u->uv.len = s;
  u->uv.metatable = NULL;
  u->uv.env = e;
  return u;
}